

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void run<ANSsint<10u>>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *input_name
                      )

{
  uint32_t *puVar1;
  pointer puVar2;
  pointer pcVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  size_t sVar8;
  long lVar9;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar10 [16];
  undefined1 extraout_var [56];
  undefined1 auVar12 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM4 [16];
  pair<double,_unsigned_long> pVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  size_t local_c8;
  unsigned_long local_c0;
  long local_b8;
  long local_b0;
  string *local_a8;
  long local_a0;
  long local_98;
  double local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  undefined1 auVar11 [64];
  
  auVar13 = in_ZMM3._0_16_;
  auVar12 = in_ZMM2._0_16_;
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVar14 = compute_entropy(puVar1,(long)(input->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1
                                  >> 2);
  local_90 = pVar14.first;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_f8,
             ((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start) * 2,(allocator_type *)local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88,
             ((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start) * 2,(allocator_type *)local_70);
  lVar7 = std::chrono::_V2::system_clock::now();
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar8 = ans_sint_compress<10u>
                    (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,puVar1,
                     (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
  lVar9 = std::chrono::_V2::system_clock::now();
  local_98 = (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,sVar8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_e0,
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)local_70);
  local_b0 = lVar7;
  local_a0 = lVar9;
  local_b8 = std::chrono::_V2::system_clock::now();
  ans_sint_decompress(local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2,
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  local_c8 = sVar8;
  local_c0 = pVar14.second;
  local_a8 = input_name;
  lVar7 = std::chrono::_V2::system_clock::now();
  puVar4 = local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar11._8_56_ = extraout_var;
  auVar11._0_8_ = extraout_XMM1_Qa;
  auVar10 = auVar11._0_16_;
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ANSsint<10u>::name_abi_cxx11_();
  sVar8 = (long)puVar2 - (long)puVar1 >> 2;
  REQUIRE_EQUAL(puVar1,puVar4,sVar8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (local_a8->_M_dataplus)._M_p;
  puVar2 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ANSsint<10u>::name_abi_cxx11_();
  auVar5 = vcvtusi2sd_avx512f(auVar10,local_a0 - local_b0);
  auVar10 = vcvtusi2sd_avx512f(auVar10,local_98 >> 2);
  auVar12 = vcvtusi2sd_avx512f(auVar12,lVar7 - local_b8);
  auVar13 = vcvtusi2sd_avx512f(auVar13,sVar8);
  auVar6 = vcvtusi2sd_avx512f(in_XMM4,local_c8 << 3);
  printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%2.3f\t\t\n",local_90,
         auVar6._0_8_ / auVar10._0_8_,auVar5._0_8_ / auVar10._0_8_,auVar12._0_8_ / auVar13._0_8_,
         pcVar3,(ulong)((long)puVar4 - (long)puVar2) >> 2 & 0xffffffff,local_c0,local_70[0]);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  fflush(_stdout);
  if (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run(std::vector<uint32_t>& input, std::string input_name)
{
    // (0) compute entropy
    auto [input_entropy, sigma] = compute_entropy(input);

    // (1) encode
    std::vector<uint8_t> encoded_data(input.size() * 8);
    std::vector<uint8_t> tmp_buf(input.size() * 8);

    size_t encoded_bytes;
    size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_encode = std::chrono::high_resolution_clock::now();
        encoded_bytes = t_compressor::encode(input.data(), input.size(),
            encoded_data.data(), encoded_data.size(), tmp_buf.data());
        auto stop_encode = std::chrono::high_resolution_clock::now();
        auto encoding_time_ns = stop_encode - start_encode;
        encoding_time_ns_min
            = std::min((size_t)encoding_time_ns.count(), encoding_time_ns_min);
    }

    double BPI = double(encoded_bytes * 8) / double(input.size());
    double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);
    double enc_ns_per_int = double(encoding_time_ns_min) / double(input.size());

    // (2) decode
    encoded_data.resize(encoded_bytes);
    std::vector<uint32_t> recover(input.size());
    size_t decode_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_decode = std::chrono::high_resolution_clock::now();
        t_compressor::decode(encoded_data.data(), encoded_data.size(),
            recover.data(), recover.size(), tmp_buf.data());
        auto stop_decode = std::chrono::high_resolution_clock::now();
        auto decode_time_ns = stop_decode - start_decode;
        decode_time_ns_min
            = std::min((size_t)decode_time_ns.count(), decode_time_ns_min);
    }
    double decode_IPS = compute_ips(input.size(), decode_time_ns_min);
    double dec_ns_per_int = double(decode_time_ns_min) / double(input.size());

    // (3) verify
    REQUIRE_EQUAL(
        input.data(), recover.data(), input.size(), t_compressor::name());

    // (4) output stats
    printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%"
           "2.3f\t\t\n",
        input_name.c_str(), (uint32_t)input.size(), (uint32_t)sigma,
        t_compressor::name().c_str(), input_entropy, BPI, enc_ns_per_int,
        dec_ns_per_int);
    fflush(stdout);
}